

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O0

void __thiscall Pl_QPDFTokenizer::~Pl_QPDFTokenizer(Pl_QPDFTokenizer *this)

{
  Pl_QPDFTokenizer *this_local;
  
  ~Pl_QPDFTokenizer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_QPDFTokenizer::~Pl_QPDFTokenizer() = default;